

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.hpp
# Opt level: O2

void * __thiscall cs::token_base::operator_new(token_base *this,size_t size)

{
  void *ptr;
  
  ptr = ::operator_new((ulong)this);
  garbage_collector<cs::token_base>::add((garbage_collector<cs::token_base> *)&gc,ptr);
  return ptr;
}

Assistant:

static void *operator new(std::size_t size)
		{
			void *ptr = ::operator new(size);
			gc.add(ptr);
			return ptr;
		}